

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

void __thiscall player_t::DestroyPSprites(player_t *this)

{
  DPSprite *pDVar1;
  DPSprite *next;
  DPSprite *pspr;
  player_t *this_local;
  
  next = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&this->psprites);
  TObjPtr<DPSprite>::operator=(&this->psprites,(DPSprite *)0x0);
  while (next != (DPSprite *)0x0) {
    pDVar1 = ::TObjPtr::operator_cast_to_DPSprite_((TObjPtr *)&next->Next);
    TObjPtr<DPSprite>::operator=(&next->Next,(DPSprite *)0x0);
    (*(next->super_DObject)._vptr_DObject[4])();
    next = pDVar1;
  }
  return;
}

Assistant:

void player_t::DestroyPSprites()
{
	DPSprite *pspr = psprites;
	psprites = nullptr;
	while (pspr)
	{
		DPSprite *next = pspr->Next;
		pspr->Next = nullptr;
		pspr->Destroy();
		pspr = next;
	}
}